

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

bool __thiscall FConfigFile::SetNextSection(FConfigFile *this)

{
  FConfigFile *this_local;
  
  if ((this->CurrentSection == (FConfigSection *)0x0) ||
     (this->CurrentSection = this->CurrentSection->Next,
     this->CurrentSection == (FConfigSection *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    this->CurrentEntry = this->CurrentSection->RootEntry;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FConfigFile::SetNextSection ()
{
	if (CurrentSection != NULL)
	{
		CurrentSection = CurrentSection->Next;
		if (CurrentSection != NULL)
		{
			CurrentEntry = CurrentSection->RootEntry;
			return true;
		}
	}
	return false;
}